

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::TestBuilder
          (TestBuilder *this,CScript *script_,string *comment_,uint32_t flags_,bool P2SH,
          WitnessMode wm,int witnessversion,CAmount nValue_)

{
  Span<const_unsigned_char> input;
  Span<unsigned_char> output;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  CScript *pCVar1;
  undefined4 in_ECX;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  long in_FS_OFFSET;
  undefined8 in_stack_00000010;
  uint256 hash_1;
  uint160 hash;
  CScript scriptPubKey;
  CSHA256 *in_stack_fffffffffffffb18;
  CMutableTransaction *in_stack_fffffffffffffb20;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffb28;
  CSHA256 *in_stack_fffffffffffffb30;
  CHash160 *in_stack_fffffffffffffb38;
  uchar *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  opcodetype in_stack_fffffffffffffb4c;
  CScript *in_stack_fffffffffffffb50;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  int nValue;
  CTransaction *in_stack_fffffffffffffb70;
  CScript *in_stack_fffffffffffffb78;
  CScript *in_stack_fffffffffffffb80;
  CMutableTransaction local_358 [5];
  Span<unsigned_char> local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  CTransaction local_1b8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_8;
  
  nValue = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_fffffffffffffb18,(CScript *)0xa46fd3);
  CScript::CScript((CScript *)in_stack_fffffffffffffb18);
  CScript::CScript((CScript *)in_stack_fffffffffffffb18);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_fffffffffffffb18);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb18);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb18);
  *(undefined1 *)(in_RDI + 0xc0) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb18);
  std::__cxx11::string::string
            (in_stack_fffffffffffffb60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb58._M_extent_value);
  *(undefined4 *)(in_RDI + 0x100) = in_ECX;
  *(undefined4 *)(in_RDI + 0x104) = 0;
  *(undefined8 *)(in_RDI + 0x108) = in_stack_00000010;
  CScript::CScript((CScript *)in_stack_fffffffffffffb18,(CScript *)0xa470d9);
  if (in_R9D == 1) {
    uint160::uint160((uint160 *)in_stack_fffffffffffffb18);
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_48 = 0;
    CHash160::CHash160((CHash160 *)in_stack_fffffffffffffb18);
    Span<unsigned_char>::Span<CScript>
              ((Span<unsigned_char> *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20
               ,in_stack_fffffffffffffb18);
    local_218 = Span<unsigned_char>::subspan
                          ((Span<unsigned_char> *)in_stack_fffffffffffffb28,
                           (size_t)in_stack_fffffffffffffb20);
    Span<const_unsigned_char>::Span<unsigned_char,_0>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb18,
               (Span<unsigned_char> *)0xa47198);
    input.m_size = (size_t)in_stack_fffffffffffffb38;
    input.m_data = (uchar *)in_stack_fffffffffffffb30;
    CHash160::Write((CHash160 *)in_stack_fffffffffffffb28,input);
    Span<unsigned_char>::Span<uint160>
              ((Span<unsigned_char> *)in_stack_fffffffffffffb28,(uint160 *)in_stack_fffffffffffffb20
               ,in_stack_fffffffffffffb18);
    output.m_size._0_4_ = in_stack_fffffffffffffb48;
    output.m_data = in_stack_fffffffffffffb40;
    output.m_size._4_4_ = in_stack_fffffffffffffb4c;
    CHash160::Finalize(in_stack_fffffffffffffb38,output);
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    CScript::CScript((CScript *)in_stack_fffffffffffffb18);
    CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    ToByteVector<uint160>((uint160 *)in_stack_fffffffffffffb58._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffb28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
    b._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
    b._M_ptr = (pointer)in_stack_fffffffffffffb50;
    CScript::operator<<((CScript *)in_stack_fffffffffffffb38,b);
    CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
    CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    CScript::CScript((CScript *)in_stack_fffffffffffffb18);
    CScript::operator<<((CScript *)in_stack_fffffffffffffb28,(int64_t)in_stack_fffffffffffffb20);
    ToByteVector<uint160>((uint160 *)in_stack_fffffffffffffb58._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffb28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
    b_00._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
    b_00._M_ptr = (pointer)in_stack_fffffffffffffb50;
    CScript::operator<<((CScript *)in_stack_fffffffffffffb38,b_00);
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
    CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  }
  else if (in_R9D == 2) {
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    uint256::uint256((uint256 *)in_stack_fffffffffffffb18);
    CSHA256::CSHA256(in_stack_fffffffffffffb18);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::data
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffb18);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffb28);
    CSHA256::Write((CSHA256 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
    base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffb18);
    CSHA256::Finalize(in_stack_fffffffffffffb30,(uchar *)in_stack_fffffffffffffb28);
    local_1b8.version = 0;
    local_1b8.nLockTime = 0;
    local_1b8.m_has_witness = false;
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_1b8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_1b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CScript::CScript((CScript *)in_stack_fffffffffffffb18);
    CScript::operator<<((CScript *)in_stack_fffffffffffffb28,(int64_t)in_stack_fffffffffffffb20);
    ToByteVector<uint256>((uint256 *)in_stack_fffffffffffffb58._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffb28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
    b_01._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
    b_01._M_ptr = (pointer)in_stack_fffffffffffffb50;
    in_stack_fffffffffffffb80 = CScript::operator<<((CScript *)in_stack_fffffffffffffb38,b_01);
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
    CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  }
  if ((in_R8B & 1) != 0) {
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    local_1b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    in_stack_fffffffffffffb70 = &local_1b8;
    CScript::CScript((CScript *)in_stack_fffffffffffffb18);
    in_stack_fffffffffffffb78 =
         CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    CScriptID::CScriptID
              ((CScriptID *)in_stack_fffffffffffffb30,(CScript *)in_stack_fffffffffffffb28);
    ToByteVector<CScriptID>((CScriptID *)in_stack_fffffffffffffb58._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffb28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
    b_02._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
    b_02._M_ptr = (pointer)in_stack_fffffffffffffb50;
    pCVar1 = CScript::operator<<((CScript *)in_stack_fffffffffffffb38,b_02);
    nValue = (int)((ulong)pCVar1 >> 0x20);
    CScript::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    CScript::operator=((CScript *)in_stack_fffffffffffffb28,(CScript *)in_stack_fffffffffffffb20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
    CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  }
  BuildCreditingTransaction((CScript *)in_stack_fffffffffffffb70,nValue);
  ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffffb20);
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb28,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb20);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffb18);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb18);
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffffb18);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_fffffffffffffb18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffb28);
  BuildSpendingTransaction
            (in_stack_fffffffffffffb80,(CScriptWitness *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  CMutableTransaction::operator=(local_358,in_stack_fffffffffffffb20);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb18);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_fffffffffffffb18);
  CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TestBuilder(const CScript& script_, const std::string& comment_, uint32_t flags_, bool P2SH = false, WitnessMode wm = WitnessMode::NONE, int witnessversion = 0, CAmount nValue_ = 0) : script(script_), comment(comment_), flags(flags_), nValue(nValue_)
    {
        CScript scriptPubKey = script;
        if (wm == WitnessMode::PKH) {
            uint160 hash;
            CHash160().Write(Span{script}.subspan(1)).Finalize(hash);
            script = CScript() << OP_DUP << OP_HASH160 << ToByteVector(hash) << OP_EQUALVERIFY << OP_CHECKSIG;
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        } else if (wm == WitnessMode::SH) {
            witscript = scriptPubKey;
            uint256 hash;
            CSHA256().Write(witscript.data(), witscript.size()).Finalize(hash.begin());
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        }
        if (P2SH) {
            redeemscript = scriptPubKey;
            scriptPubKey = CScript() << OP_HASH160 << ToByteVector(CScriptID(redeemscript)) << OP_EQUAL;
        }
        creditTx = MakeTransactionRef(BuildCreditingTransaction(scriptPubKey, nValue));
        spendTx = BuildSpendingTransaction(CScript(), CScriptWitness(), *creditTx);
    }